

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::render
               (TestContext *testContext,RenderContext *renderContext,
               TextureRenderer *textureRenderer,ResultCollector *results,Random *rng,deUint32 name,
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *data,ImageInfo *info,Verify verify)

{
  deUint32 dVar1;
  int iVar2;
  TestLog *log;
  pointer pCVar3;
  void *pvVar4;
  byte bVar5;
  undefined8 uVar6;
  Vec4 VVar7;
  bool bVar8;
  bool bVar9;
  int i;
  int iVar10;
  TextureChannelClass TVar11;
  ChannelOrder format_00;
  ContextType ctxType;
  GLenum GVar12;
  int iVar13;
  CubeFace CVar14;
  undefined4 extraout_var;
  ContextInfo *this;
  ulong uVar16;
  ObjectTraits *traits;
  ulong uVar17;
  long lVar18;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
  *__return_storage_ptr__;
  long lVar19;
  int faceNdx;
  long lVar20;
  int *piVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  TexDecompressionParams decompressParams;
  TextureFormat readPixelsFormat;
  TextureFormat format;
  TextureLevel renderbuffer;
  Framebuffer framebuffer;
  size_type __dnew;
  undefined8 uStack_260;
  TextureRenderer *local_250;
  ConstPixelBufferAccess refRenderbuffer;
  long alStack_1d0 [3];
  IVec4 srcBits;
  undefined1 local_1a8 [32];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_188;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_170;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_158;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_140 [11];
  Functions *pFVar15;
  
  dVar1 = info->m_target;
  if ((int)dVar1 < 0x8513) {
    if (dVar1 == 0xde1) {
      bVar9 = glu::isCompressedFormat(info->m_format);
      if (!bVar9) {
        getLevelAccesses((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          *)&srcBits,data,info);
        refRenderbuffer.m_format.order =
             (int)((ulong)(srcBits.m_data._8_8_ - srcBits.m_data._0_8_) >> 3) * -0x33333333;
        refRenderbuffer.m_size.m_data[0] = srcBits.m_data[0];
        refRenderbuffer.m_size.m_data[1] = srcBits.m_data[1];
        renderTexture2DView((TestContext *)testContext->m_log,renderContext,textureRenderer,results,
                            rng,name,info,(Texture2DView *)&refRenderbuffer,verify);
        goto LAB_0165b922;
      }
      srcBits.m_data[0] = 0;
      srcBits.m_data[1] = 0;
      srcBits.m_data[2] = 0;
      srcBits.m_data[3] = 0;
      local_1a8._0_8_ = (pointer)0x0;
      refRenderbuffer.m_size.m_data[2] = 0;
      refRenderbuffer.m_pitch.m_data[0] = 0;
      refRenderbuffer.m_format.order = R;
      refRenderbuffer.m_format.type = SNORM_INT8;
      refRenderbuffer.m_size.m_data[0] = 0;
      refRenderbuffer.m_size.m_data[1] = 0;
      decompressTexture((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                         *)&srcBits,
                        (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                        &refRenderbuffer,renderContext,info,data);
      renderbuffer.m_format.order =
           (int)((ulong)(refRenderbuffer.m_size.m_data._0_8_ - (long)refRenderbuffer.m_format) >> 3)
           * -0x33333333;
      renderbuffer.m_size.m_data[0] = refRenderbuffer.m_format.order;
      renderbuffer.m_size.m_data[1] = refRenderbuffer.m_format.type;
      renderTexture2DView((TestContext *)testContext->m_log,renderContext,textureRenderer,results,
                          rng,name,info,(Texture2DView *)&renderbuffer,verify);
      if (refRenderbuffer.m_format != (TextureFormat)0x0) {
        operator_delete((void *)refRenderbuffer.m_format,
                        refRenderbuffer._16_8_ - (long)refRenderbuffer.m_format);
      }
    }
    else {
      if (dVar1 != 0x806f) {
        return;
      }
      bVar9 = glu::isCompressedFormat(info->m_format);
      if (!bVar9) {
        getLevelAccesses((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          *)&srcBits,data,info);
        tcu::Texture3DView::Texture3DView
                  ((Texture3DView *)&refRenderbuffer,
                   (int)((ulong)(srcBits.m_data._8_8_ - srcBits.m_data._0_8_) >> 3) * -0x33333333,
                   (ConstPixelBufferAccess *)srcBits.m_data._0_8_);
        renderTexture3DView((TestContext *)testContext->m_log,renderContext,textureRenderer,results,
                            rng,name,info,(Texture3DView *)&refRenderbuffer,verify);
LAB_0165b922:
        if (srcBits.m_data._0_8_ == 0) {
          return;
        }
        operator_delete((void *)srcBits.m_data._0_8_,local_1a8._0_8_ - srcBits.m_data._0_8_);
        return;
      }
      srcBits.m_data[0] = 0;
      srcBits.m_data[1] = 0;
      srcBits.m_data[2] = 0;
      srcBits.m_data[3] = 0;
      local_1a8._0_8_ = (pointer)0x0;
      refRenderbuffer.m_size.m_data[2] = 0;
      refRenderbuffer.m_pitch.m_data[0] = 0;
      refRenderbuffer.m_format.order = R;
      refRenderbuffer.m_format.type = SNORM_INT8;
      refRenderbuffer.m_size.m_data[0] = 0;
      refRenderbuffer.m_size.m_data[1] = 0;
      decompressTexture((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                         *)&srcBits,
                        (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                        &refRenderbuffer,renderContext,info,data);
      tcu::Texture3DView::Texture3DView
                ((Texture3DView *)&renderbuffer,
                 (int)((ulong)(refRenderbuffer.m_size.m_data._0_8_ - (long)refRenderbuffer.m_format)
                      >> 3) * -0x33333333,(ConstPixelBufferAccess *)refRenderbuffer.m_format);
      renderTexture3DView((TestContext *)testContext->m_log,renderContext,textureRenderer,results,
                          rng,name,info,(Texture3DView *)&renderbuffer,verify);
      if (refRenderbuffer.m_format != (TextureFormat)0x0) {
        operator_delete((void *)refRenderbuffer.m_format,
                        refRenderbuffer._16_8_ - (long)refRenderbuffer.m_format);
      }
    }
LAB_0165b465:
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::~vector((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *)&srcBits);
    return;
  }
  if (dVar1 == 0x8513) {
    bVar9 = glu::isCompressedFormat(info->m_format);
    local_250 = textureRenderer;
    if (bVar9) {
      format_00 = glu::mapGLCompressedTexFormat(info->m_format);
      readPixelsFormat.order = format_00;
      format = tcu::getUncompressedFormat(format_00);
      iVar10 = getTexelBlockSize(info->m_format);
      getTexelBlockPixelSize((anon_unknown_0 *)&__dnew,info->m_format);
      ctxType.super_ApiType.m_bits =
           (ApiType)(*renderContext->_vptr_RenderContext[2])(renderContext);
      bVar9 = glu::contextSupports(ctxType,(ApiType)0x23);
      memset(&srcBits,0,0x90);
      memset(&refRenderbuffer,0,0x90);
      this = glu::ContextInfo::create(renderContext);
      decompressParams.astcMode = ASTCMODE_LAST;
      bVar8 = tcu::isAstcFormat(format_00);
      if (bVar8) {
        bVar8 = glu::ContextInfo::isExtensionSupported(this,"GL_KHR_texture_compression_astc_hdr");
        if ((!bVar8) || (bVar8 = tcu::isAstcSRGBFormat(format_00), bVar8)) {
          if ((bVar9) ||
             (bVar9 = glu::ContextInfo::isExtensionSupported
                                (this,"GL_KHR_texture_compression_astc_ldr"), bVar9)) {
            decompressParams.astcMode = ASTCMODE_LDR;
          }
        }
        else {
          decompressParams.astcMode = ASTCMODE_HDR;
        }
      }
      lVar19 = 0;
      do {
        iVar13 = getLevelCount(info);
        std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
                  ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                   ((long)srcBits.m_data + lVar19),(long)iVar13);
        iVar13 = getLevelCount(info);
        std::
        vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
        ::resize((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                  *)((long)refRenderbuffer.m_size.m_data + lVar19 + -8),(long)iVar13);
        lVar19 = lVar19 + 0x18;
      } while (lVar19 != 0x90);
      iVar13 = getLevelCount(info);
      if (0 < iVar13) {
        lVar19 = 0;
        do {
          lVar20 = 0;
          do {
            uVar6 = renderbuffer.m_size.m_data._0_8_;
            renderbuffer.m_size.m_data._0_8_ = renderbuffer.m_size.m_data._0_8_ & 0xffffffff00000000
            ;
            renderbuffer.m_format.order = R;
            renderbuffer.m_format.type = SNORM_INT8;
            bVar5 = (byte)lVar19;
            if (info->m_target == 0x8c1a) {
              renderbuffer.m_format.order = (info->m_size).m_data[0] >> (bVar5 & 0x1f);
              if ((int)renderbuffer.m_format.order < 2) {
                renderbuffer.m_format.order = A;
              }
              renderbuffer.m_format.type = (info->m_size).m_data[1] >> (bVar5 & 0x1f);
              if ((int)renderbuffer.m_format.type < 2) {
                renderbuffer.m_format.type = SNORM_INT16;
              }
              renderbuffer.m_size.m_data[1] = SUB84(uVar6,4);
              renderbuffer.m_size.m_data[0] = (info->m_size).m_data[2];
            }
            else {
              lVar18 = 0;
              do {
                iVar13 = (info->m_size).m_data[lVar18] >> (bVar5 & 0x1f);
                if (iVar13 < 2) {
                  iVar13 = 1;
                }
                renderbuffer.m_size.m_data[lVar18 + -2] = iVar13;
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
            }
            framebuffer.super_ObjectWrapper.m_traits =
                 (ObjectTraits *)
                 ((ulong)framebuffer.super_ObjectWrapper.m_traits & 0xffffffff00000000);
            framebuffer.super_ObjectWrapper.m_gl = (Functions *)0x0;
            lVar18 = 0;
            do {
              iVar13 = renderbuffer.m_size.m_data[lVar18 + -2];
              iVar2 = *(int *)((long)&__dnew + lVar18 * 4);
              *(uint *)((long)&framebuffer.super_ObjectWrapper.m_gl + lVar18 * 4) =
                   (iVar13 / iVar2 + 1) - (uint)(iVar13 % iVar2 == 0);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            decompressTextureLevel
                      (&decompressParams,
                       (ArrayBuffer<unsigned_char,_1UL,_1UL> *)
                       (*(long *)((&refRenderbuffer.m_size)[lVar20 * 2 + -1].m_data + 1) +
                       lVar19 * 0x10),
                       (PixelBufferAccess *)
                       (*(long *)((long)&srcBits + lVar20 * 0x18) + lVar19 * 0x28),
                       &readPixelsFormat.order,&format,(IVec3 *)&renderbuffer,
                       (void *)((long)(int)(iVar10 * (int)lVar20 *
                                            (uint)framebuffer.super_ObjectWrapper.m_gl *
                                            framebuffer.super_ObjectWrapper.m_gl._4_4_ *
                                           (uint)framebuffer.super_ObjectWrapper.m_traits) +
                               (long)(data->
                                     super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[lVar19].m_ptr));
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
          lVar19 = lVar19 + 1;
          iVar13 = getLevelCount(info);
        } while (lVar19 < iVar13);
      }
      lVar19 = 0;
      piVar21 = srcBits.m_data;
      do {
        pFVar15 = *(Functions **)piVar21;
        CVar14 = glu::getCubeFaceFromGL(*(deUint32 *)((long)&DAT_01c88f20 + lVar19));
        (&framebuffer.super_ObjectWrapper.m_gl)[CVar14] = pFVar15;
        lVar19 = lVar19 + 4;
        piVar21 = piVar21 + 6;
      } while (lVar19 != 0x18);
      iVar10 = getLevelCount(info);
      tcu::TextureCubeView::TextureCubeView
                ((TextureCubeView *)&renderbuffer,iVar10,
                 (ConstPixelBufferAccess *(*) [6])&framebuffer);
      renderTextureCubemapView
                ((TestContext *)testContext->m_log,renderContext,local_250,results,rng,name,info,
                 (TextureCubeView *)&renderbuffer,verify);
      if (this != (ContextInfo *)0x0) {
        (*this->_vptr_ContextInfo[1])();
      }
      lVar19 = 0x78;
      do {
        std::
        vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
        ::~vector((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                   *)((long)refRenderbuffer.m_size.m_data + lVar19 + -8));
        lVar19 = lVar19 + -0x18;
      } while (lVar19 != -0x18);
      lVar19 = 0x90;
      do {
        pvVar4 = *(void **)((long)alStack_1d0 + lVar19);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,*(long *)((long)alStack_1d0 + lVar19 + 0x10) - (long)pvVar4);
        }
        lVar19 = lVar19 + -0x18;
      } while (lVar19 != 0);
      return;
    }
    __return_storage_ptr__ =
         (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
         &srcBits;
    getCubeLevelAccesses(__return_storage_ptr__,data,info,0);
    getCubeLevelAccesses
              ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
               (local_1a8 + 8),data,info,1);
    getCubeLevelAccesses(&local_188,data,info,2);
    getCubeLevelAccesses(&local_170,data,info,3);
    getCubeLevelAccesses(&local_158,data,info,4);
    getCubeLevelAccesses(local_140,data,info,5);
    lVar19 = 0;
    do {
      pCVar3 = (__return_storage_ptr__->
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               )._M_impl.super__Vector_impl_data._M_start;
      CVar14 = glu::getCubeFaceFromGL(*(deUint32 *)((long)&DAT_01c88f20 + lVar19));
      *(pointer *)(renderbuffer.m_size.m_data + (ulong)CVar14 * 2 + -2) = pCVar3;
      lVar19 = lVar19 + 4;
      __return_storage_ptr__ = __return_storage_ptr__ + 1;
    } while (lVar19 != 0x18);
    iVar10 = getLevelCount(info);
    tcu::TextureCubeView::TextureCubeView
              ((TextureCubeView *)&refRenderbuffer,iVar10,
               (ConstPixelBufferAccess *(*) [6])&renderbuffer);
    renderTextureCubemapView
              ((TestContext *)testContext->m_log,renderContext,local_250,results,rng,name,info,
               (TextureCubeView *)&refRenderbuffer,verify);
    lVar19 = 0x90;
    do {
      pvVar4 = *(void **)((long)alStack_1d0 + lVar19);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,*(long *)((long)alStack_1d0 + lVar19 + 0x10) - (long)pvVar4);
      }
      lVar19 = lVar19 + -0x18;
    } while (lVar19 != 0);
    return;
  }
  if (dVar1 == 0x8c1a) {
    bVar9 = glu::isCompressedFormat(info->m_format);
    if (!bVar9) {
      getLevelAccesses((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        *)&srcBits,data,info);
      tcu::Texture2DArrayView::Texture2DArrayView
                ((Texture2DArrayView *)&refRenderbuffer,
                 (int)((ulong)(srcBits.m_data._8_8_ - srcBits.m_data._0_8_) >> 3) * -0x33333333,
                 (ConstPixelBufferAccess *)srcBits.m_data._0_8_);
      renderTexture2DArrayView
                ((TestContext *)testContext->m_log,renderContext,textureRenderer,results,rng,name,
                 info,(Texture2DArrayView *)&refRenderbuffer,verify);
      goto LAB_0165b922;
    }
    srcBits.m_data[0] = 0;
    srcBits.m_data[1] = 0;
    srcBits.m_data[2] = 0;
    srcBits.m_data[3] = 0;
    local_1a8._0_8_ = (pointer)0x0;
    refRenderbuffer.m_size.m_data[2] = 0;
    refRenderbuffer.m_pitch.m_data[0] = 0;
    refRenderbuffer.m_format.order = R;
    refRenderbuffer.m_format.type = SNORM_INT8;
    refRenderbuffer.m_size.m_data[0] = 0;
    refRenderbuffer.m_size.m_data[1] = 0;
    decompressTexture((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                       *)&srcBits,
                      (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                      &refRenderbuffer,renderContext,info,data);
    tcu::Texture2DArrayView::Texture2DArrayView
              ((Texture2DArrayView *)&renderbuffer,
               (int)((ulong)(refRenderbuffer.m_size.m_data._0_8_ - (long)refRenderbuffer.m_format)
                    >> 3) * -0x33333333,(ConstPixelBufferAccess *)refRenderbuffer.m_format);
    renderTexture2DArrayView
              ((TestContext *)testContext->m_log,renderContext,textureRenderer,results,rng,name,info
               ,(Texture2DArrayView *)&renderbuffer,verify);
    if (refRenderbuffer.m_format != (TextureFormat)0x0) {
      operator_delete((void *)refRenderbuffer.m_format,
                      refRenderbuffer._16_8_ - (long)refRenderbuffer.m_format);
    }
    goto LAB_0165b465;
  }
  if (dVar1 != 0x8d41) {
    return;
  }
  iVar10 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  pFVar15 = (Functions *)CONCAT44(extraout_var,iVar10);
  log = testContext->m_log;
  format = glu::mapGLInternalFormat(info->m_format);
  iVar10 = (info->m_size).m_data[0];
  iVar13 = (info->m_size).m_data[1];
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&refRenderbuffer,&format,iVar10,iVar13,1,
             ((data->
              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->m_ptr);
  TVar11 = tcu::getTextureChannelClass(format.type);
  if (TVar11 < TEXTURECHANNELCLASS_LAST) {
    uVar16 = *(ulong *)(&DAT_01c88fb0 + (ulong)TVar11 * 8);
    uVar17 = 8;
  }
  else {
    uVar17 = 0x15;
    uVar16 = 0x2600000000;
  }
  readPixelsFormat = (TextureFormat)(uVar16 | uVar17);
  tcu::TextureLevel::TextureLevel(&renderbuffer,&readPixelsFormat,iVar10,iVar13,1);
  traits = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&framebuffer.super_ObjectWrapper,pFVar15,traits);
  (*pFVar15->bindFramebuffer)(0x8d40,framebuffer.super_ObjectWrapper.m_object);
  GVar12 = (*pFVar15->getError)();
  glu::checkError(GVar12,"Failed to create and bind framebuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x695);
  (*pFVar15->bindRenderbuffer)(0x8d41,name);
  (*pFVar15->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,name);
  GVar12 = (*pFVar15->getError)();
  glu::checkError(GVar12,"Failed to bind and attach renderbuffer to framebuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x699);
  if (verify != VERIFY_NONE) {
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&srcBits,&renderbuffer);
    glu::readPixels(renderContext,0,0,(PixelBufferAccess *)&srcBits);
  }
  (*pFVar15->bindRenderbuffer)(0x8d41,0);
  (*pFVar15->bindFramebuffer)(0x8d40,0);
  GVar12 = (*pFVar15->getError)();
  glu::checkError(GVar12,"Failed to unbind renderbuffer and framebuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x6a0);
  glu::ObjectWrapper::~ObjectWrapper(&framebuffer.super_ObjectWrapper);
  if (verify != VERIFY_COMPARE_REFERENCE) goto LAB_0165bed7;
  bVar9 = isFloatFormat(info->m_format);
  if (bVar9) {
    framebuffer.super_ObjectWrapper.m_gl = (Functions *)0x200000002;
    framebuffer.super_ObjectWrapper.m_traits = (ObjectTraits *)0x200000002;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&srcBits,&renderbuffer);
    bVar9 = tcu::floatUlpThresholdCompare
                      (log,"Image comparison","Image comparison",&refRenderbuffer,
                       (ConstPixelBufferAccess *)&srcBits,(UVec4 *)&framebuffer,COMPARE_LOG_ON_ERROR
                      );
    if (!bVar9) {
      srcBits.m_data._0_8_ = local_1a8;
      __dnew = 0x18;
      srcBits.m_data._0_8_ = std::__cxx11::string::_M_create((ulong *)&srcBits,(ulong)&__dnew);
      VVar7.m_data = ___dnew;
      local_1a8._0_8_ = __dnew;
      builtin_strncpy((char *)srcBits.m_data._0_8_,"Image comparison failed.",0x18);
      srcBits.m_data[2] = (undefined4)__dnew;
      srcBits.m_data[3] = __dnew._4_4_;
      *(char *)(srcBits.m_data._0_8_ + __dnew) = '\0';
      ___dnew = VVar7.m_data;
      tcu::ResultCollector::fail(results,(string *)&srcBits);
      goto LAB_0165beba;
    }
    srcBits.m_data._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(srcBits.m_data + 2));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(srcBits.m_data + 2),"Image comarison passed.",0x17);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&srcBits,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    bVar9 = isIntFormat(info->m_format);
    if ((bVar9) || (bVar9 = isUintFormat(info->m_format), bVar9)) {
      framebuffer.super_ObjectWrapper.m_gl = (Functions *)&DAT_100000001;
      framebuffer.super_ObjectWrapper.m_traits = (ObjectTraits *)&DAT_100000001;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&srcBits,&renderbuffer);
      bVar9 = tcu::intThresholdCompare
                        (log,"Image comparison","Image comparison",&refRenderbuffer,
                         (ConstPixelBufferAccess *)&srcBits,(UVec4 *)&framebuffer,
                         COMPARE_LOG_ON_ERROR);
      if (!bVar9) {
        srcBits.m_data._0_8_ = local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&srcBits,"Image comparison failed.","");
        tcu::ResultCollector::fail(results,(string *)&srcBits);
        goto LAB_0165beba;
      }
      srcBits.m_data._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(srcBits.m_data + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(srcBits.m_data + 2),"Image comarison passed.",0x17);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&srcBits,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      tcu::getTextureFormatBitDepth((tcu *)&srcBits,&format);
      tcu::getTextureFormatBitDepth((tcu *)&framebuffer,&readPixelsFormat);
      auVar22._0_4_ =
           (int)(float)((~-(uint)(srcBits.m_data[0] <
                                 (int)(uint)framebuffer.super_ObjectWrapper.m_gl) &
                         (uint)framebuffer.super_ObjectWrapper.m_gl |
                        srcBits.m_data[0] &
                        -(uint)(srcBits.m_data[0] < (int)(uint)framebuffer.super_ObjectWrapper.m_gl)
                        ) * 0x800000 + 0x3f800000);
      auVar22._4_4_ =
           (int)(float)((~-(uint)(srcBits.m_data[1] <
                                 (int)framebuffer.super_ObjectWrapper.m_gl._4_4_) &
                         framebuffer.super_ObjectWrapper.m_gl._4_4_ |
                        srcBits.m_data[1] &
                        -(uint)(srcBits.m_data[1] < (int)framebuffer.super_ObjectWrapper.m_gl._4_4_)
                        ) * 0x800000 + 0x3f800000);
      auVar22._8_4_ =
           (int)(float)((~-(uint)(srcBits.m_data[2] <
                                 (int)(uint)framebuffer.super_ObjectWrapper.m_traits) &
                         (uint)framebuffer.super_ObjectWrapper.m_traits |
                        srcBits.m_data[2] &
                        -(uint)(srcBits.m_data[2] <
                               (int)(uint)framebuffer.super_ObjectWrapper.m_traits)) * 0x800000 +
                       0x3f800000);
      auVar22._12_4_ =
           (int)(float)((~-(uint)(srcBits.m_data[3] <
                                 (int)framebuffer.super_ObjectWrapper.m_traits._4_4_) &
                         framebuffer.super_ObjectWrapper.m_traits._4_4_ |
                        srcBits.m_data[3] &
                        -(uint)(srcBits.m_data[3] <
                               (int)framebuffer.super_ObjectWrapper.m_traits._4_4_)) * 0x800000 +
                       0x3f800000);
      auVar24._4_4_ = auVar22._4_4_;
      auVar24._0_4_ = auVar22._4_4_;
      auVar24._8_4_ = auVar22._12_4_;
      auVar24._12_4_ = auVar22._12_4_;
      auVar23._0_4_ = (float)(int)(-auVar22._0_4_ ^ 0xffffffff);
      auVar23._4_4_ = (float)(int)(-auVar22._4_4_ ^ 0xffffffff);
      auVar23._8_4_ = (float)(int)((uint)((auVar22._8_8_ & 0xffffffff) * 0xffffffff) ^ 0xffffffff);
      auVar23._12_4_ = (float)(int)((uint)((auVar24._8_8_ & 0xffffffff) * 0xffffffff) ^ 0xffffffff);
      ___dnew = (float  [4])divps(_DAT_01a1c5b0,auVar23);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&srcBits,&renderbuffer);
      bVar9 = tcu::floatThresholdCompare
                        (log,"Image comparison","Image comparison",&refRenderbuffer,
                         (ConstPixelBufferAccess *)&srcBits,(Vec4 *)&__dnew,COMPARE_LOG_ON_ERROR);
      if (!bVar9) {
        srcBits.m_data._0_8_ = local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&srcBits,"Image comparison failed.","");
        tcu::ResultCollector::fail(results,(string *)&srcBits);
LAB_0165beba:
        if ((undefined1 *)srcBits.m_data._0_8_ != local_1a8) {
          operator_delete((void *)srcBits.m_data._0_8_,(ulong)(local_1a8._0_8_ + 1));
        }
        goto LAB_0165bed7;
      }
      srcBits.m_data._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(srcBits.m_data + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(srcBits.m_data + 2),"Image comarison passed.",0x17);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&srcBits,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(srcBits.m_data + 2));
  std::ios_base::~ios_base((ios_base *)local_140);
LAB_0165bed7:
  tcu::TextureLevel::~TextureLevel(&renderbuffer);
  return;
}

Assistant:

void render (tcu::TestContext&						testContext,
			 glu::RenderContext&					renderContext,
			 TextureRenderer&						textureRenderer,
			 tcu::ResultCollector&					results,
			 de::Random&							rng,
			 deUint32								name,
			 const vector<ArrayBuffer<deUint8> >&	data,
			 const ImageInfo&						info,
			 Verify									verify)
{
	switch (info.getTarget())
	{
		case GL_TEXTURE_2D:
			renderTexture2D(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_TEXTURE_3D:
			renderTexture3D(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_TEXTURE_CUBE_MAP:
			renderTextureCubemap(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_TEXTURE_2D_ARRAY:
			renderTexture2DArray(testContext, renderContext, textureRenderer, results, rng, name, data, info, verify);
			break;

		case GL_RENDERBUFFER:
			renderRenderbuffer(testContext, renderContext, results, name, data, info, verify);
			break;

		default:
			DE_ASSERT(false);
	}
}